

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O2

void __thiscall chatra::Reference::setWithoutBothLock(Reference *this,Reference *ref)

{
  anon_union_8_4_9b5272a9_for_ReferenceNode_3 aVar1;
  bool bVar2;
  ReferenceNode *pRVar3;
  ReferenceNode *pRVar4;
  
  pRVar3 = ref->node;
  switch(pRVar3->type) {
  case Bool:
    pRVar4 = this->node;
    bVar2 = (pRVar3->field_3).vBool;
    pRVar4->type = Bool;
    pRVar4->object = (Object *)0x0;
    (pRVar4->field_3).vBool = bVar2;
    break;
  case Int:
    pRVar4 = this->node;
    aVar1 = pRVar3->field_3;
    pRVar4->type = Int;
    pRVar4->object = (Object *)0x0;
    pRVar4->field_3 = aVar1;
    break;
  case Float:
    pRVar4 = this->node;
    aVar1 = pRVar3->field_3;
    pRVar4->type = Float;
    pRVar4->object = (Object *)0x0;
    pRVar4->field_3 = aVar1;
    break;
  case Object:
    ReferenceNode::setObject(this->node,pRVar3->object);
    return;
  }
  return;
}

Assistant:

void setWithoutBothLock(const Reference& ref) const {
		chatra_assert(node != nullptr && ref.node != nullptr);
		switch (ref.node->type) {
		case ReferenceValueType::Bool:  node->setBool(ref.node->vBool); break;
		case ReferenceValueType::Int:  node->setInt(ref.node->vInt); break;
		case ReferenceValueType::Float:  node->setFloat(ref.node->vFloat); break;
		case ReferenceValueType::Object:  node->setObject(ref.node->object); break;
		}
	}